

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testValidUpdatableModelWith1024Layers(void)

{
  bool bVar1;
  ostream *poVar2;
  Result res;
  Model spec;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Model local_80;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  TensorAttributes local_28;
  TensorAttributes local_18;
  
  CoreML::Specification::Model::Model(&local_80);
  CoreML::Result::Result((Result *)local_a8);
  local_18.name = "InTensor";
  local_18.dimension = 3;
  local_18._12_4_ = 0;
  local_28.name = "OutTensor";
  local_28.dimension = 1;
  local_28._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_80,true,&local_18,&local_28,0x400,false,false);
  addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(&local_80,"OutTensor");
  CoreML::Model::validate((Result *)local_50,&local_80);
  local_a8 = local_50;
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  bVar1 = CoreML::Result::good((Result *)local_a8);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x550);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)!bVar1;
}

Assistant:

int testValidUpdatableModelWith1024Layers() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(spec, "OutTensor");

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}